

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O0

void __thiscall flatfile_tests::flatfile_allocate::test_method(flatfile_allocate *this)

{
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *add_size;
  long in_FS_OFFSET;
  bool out_of_space;
  FlatFileSeq seq;
  path data_dir;
  char *in_stack_fffffffffffff9c8;
  __native_type *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  lazy_ostream *in_stack_fffffffffffff9f0;
  FlatFilePos *in_stack_fffffffffffff9f8;
  FlatFilePos *pFVar3;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  FlatFileSeq *in_stack_fffffffffffffa08;
  bool *in_stack_fffffffffffffa28;
  size_t in_stack_fffffffffffffa30;
  FlatFilePos *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  const_string local_4e8 [2];
  lazy_ostream local_4c8 [2];
  __native_type local_46c [2];
  __native_type local_404 [2];
  const_string local_3a0 [2];
  lazy_ostream local_380 [2];
  assertion_result local_360 [2];
  __native_type local_324 [2];
  __native_type local_2bc [2];
  const_string local_258 [2];
  lazy_ostream local_238 [2];
  assertion_result local_218 [2];
  __native_type local_1dc [2];
  __native_type local_174 [2];
  path local_108;
  path local_e0;
  path local_b8 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((ArgsManager *)&in_stack_fffffffffffff9d0->__data);
  fs::path::path((path *)in_stack_fffffffffffff9c8,(path *)0x6687bd);
  FlatFileSeq::FlatFileSeq
            (in_stack_fffffffffffffa08,
             (path *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
             (char *)in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0);
  fs::path::~path((path *)in_stack_fffffffffffff9c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)in_stack_fffffffffffff9f8,(const_string *)in_stack_fffffffffffff9f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (char (*) [1])in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffff9c8,0,0x6688a5);
    local_174[0]._12_8_ =
         FlatFileSeq::Allocate
                   ((FlatFileSeq *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                    in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    local_174[0].__data.__lock = 100;
    in_stack_fffffffffffff9d8 = "100U";
    in_stack_fffffffffffff9d0 = local_174;
    in_stack_fffffffffffff9c8 = "seq.Allocate(FlatFilePos(0, 0), 1, out_of_space)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_174[0].__data.__list.__next + 4),
               &local_174[0].__data.__spins,99,1,2,&local_174[0].__data.__nusers);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)in_stack_fffffffffffff9f8,(const_string *)in_stack_fffffffffffff9f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (char (*) [1])in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffff9c8,0,0x668a25);
    FlatFileSeq::FileName
              ((FlatFileSeq *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               in_stack_fffffffffffff9f8);
    local_1dc[0]._12_8_ = std::filesystem::file_size(local_b8);
    local_1dc[0].__data.__lock = 100;
    in_stack_fffffffffffff9d8 = "100U";
    in_stack_fffffffffffff9d0 = local_1dc;
    in_stack_fffffffffffff9c8 = "fs::file_size(seq.FileName(FlatFilePos(0, 0)))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_1dc[0].__data.__list.__next + 4),
               &local_1dc[0].__data.__spins,100,1,2,&local_1dc[0].__data.__nusers);
    fs::path::~path((path *)in_stack_fffffffffffff9c8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)in_stack_fffffffffffff9f8,(const_string *)in_stack_fffffffffffff9f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9d8,
               SUB81((ulong)in_stack_fffffffffffff9d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    in_stack_fffffffffffff9c8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_218,local_238,local_258,0x65,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff9c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)in_stack_fffffffffffff9f8,(const_string *)in_stack_fffffffffffff9f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (char (*) [1])in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffff9c8,0,0x668d13);
    local_2bc[0]._12_8_ =
         FlatFileSeq::Allocate
                   ((FlatFileSeq *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                    in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    local_2bc[0].__data.__lock = 0;
    in_stack_fffffffffffff9d8 = "0U";
    in_stack_fffffffffffff9d0 = local_2bc;
    in_stack_fffffffffffff9c8 = "seq.Allocate(FlatFilePos(0, 99), 1, out_of_space)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_2bc[0].__data.__list.__next + 4),
               &local_2bc[0].__data.__spins,0x67,1,2,&local_2bc[0].__data.__nusers);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)in_stack_fffffffffffff9f8,(const_string *)in_stack_fffffffffffff9f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (char (*) [1])in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffff9c8,0,0x668e96);
    FlatFileSeq::FileName
              ((FlatFileSeq *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               in_stack_fffffffffffff9f8);
    local_324[0]._12_8_ = std::filesystem::file_size(&local_e0);
    local_324[0].__data.__lock = 100;
    in_stack_fffffffffffff9d8 = "100U";
    in_stack_fffffffffffff9d0 = local_324;
    in_stack_fffffffffffff9c8 = "fs::file_size(seq.FileName(FlatFilePos(0, 99)))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_324[0].__data.__list.__next + 4),
               &local_324[0].__data.__spins,0x68,1,2,&local_324[0].__data.__nusers);
    fs::path::~path((path *)in_stack_fffffffffffff9c8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)in_stack_fffffffffffff9f8,(const_string *)in_stack_fffffffffffff9f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9d8,
               SUB81((ulong)in_stack_fffffffffffff9d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    in_stack_fffffffffffff9c8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_360,local_380,local_3a0,0x69,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff9c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9c8);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    pFVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)in_stack_fffffffffffff9f8,(const_string *)in_stack_fffffffffffff9f0);
    add_size = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (char (*) [1])in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffff9c8,0,0x669172);
    in_stack_fffffffffffffa28 =
         (bool *)FlatFileSeq::Allocate
                           ((FlatFileSeq *)CONCAT17(uVar2,in_stack_fffffffffffffa40),pFVar3,
                            (size_t)add_size,in_stack_fffffffffffffa28);
    local_404[0].__data.__lock = 0x65;
    in_stack_fffffffffffff9d8 = "101U";
    in_stack_fffffffffffff9d0 = local_404;
    in_stack_fffffffffffff9c8 = "seq.Allocate(FlatFilePos(0, 99), 2, out_of_space)";
    local_404[0]._12_8_ = in_stack_fffffffffffffa28;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_404[0].__data.__list.__next + 4),
               &local_404[0].__data.__spins,0x6b,1,2,&local_404[0].__data.__nusers);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)in_stack_fffffffffffff9f8,(const_string *)in_stack_fffffffffffff9f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (char (*) [1])in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffff9c8,0,0x6692dd);
    FlatFileSeq::FileName
              ((FlatFileSeq *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               in_stack_fffffffffffff9f8);
    in_stack_fffffffffffffa08 = (FlatFileSeq *)std::filesystem::file_size(&local_108);
    local_46c[0].__data.__lock = 200;
    in_stack_fffffffffffff9d8 = "200U";
    in_stack_fffffffffffff9d0 = local_46c;
    in_stack_fffffffffffff9c8 = "fs::file_size(seq.FileName(FlatFilePos(0, 99)))";
    local_46c[0]._12_8_ = in_stack_fffffffffffffa08;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_46c[0].__data.__list.__next + 4),
               &local_46c[0].__data.__spins,0x6c,1,2,&local_46c[0].__data.__nusers);
    fs::path::~path((path *)in_stack_fffffffffffff9c8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9c8);
    in_stack_fffffffffffffa07 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffa07);
  do {
    pFVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa08,
               (const_string *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (size_t)pFVar3,(const_string *)in_stack_fffffffffffff9f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9d8,
               SUB81((ulong)in_stack_fffffffffffff9d0 >> 0x38,0));
    in_stack_fffffffffffff9f0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff9d0->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9d8,
               in_stack_fffffffffffff9d0->__size,(unsigned_long)in_stack_fffffffffffff9c8);
    in_stack_fffffffffffff9c8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffb58,local_4c8,local_4e8,0x6d,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff9c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  FlatFileSeq::~FlatFileSeq((FlatFileSeq *)in_stack_fffffffffffff9c8);
  fs::path::~path((path *)in_stack_fffffffffffff9c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_allocate)
{
    const auto data_dir = m_args.GetDataDirBase();
    FlatFileSeq seq(data_dir, "a", 100);

    bool out_of_space;

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 0), 1, out_of_space), 100U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 0))), 100U);
    BOOST_CHECK(!out_of_space);

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 99), 1, out_of_space), 0U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 99))), 100U);
    BOOST_CHECK(!out_of_space);

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 99), 2, out_of_space), 101U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 99))), 200U);
    BOOST_CHECK(!out_of_space);
}